

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

char * myBuf2Str(uint count,char *buf)

{
  long in_RSI;
  uint in_EDI;
  int c;
  int i;
  uint local_18;
  int local_14;
  
  if ((in_EDI == 0) || (in_RSI == 0)) {
    myBuf2Str::str[0] = '\0';
  }
  else {
    local_18 = in_EDI;
    if (0x28 < in_EDI) {
      local_18 = 0x28;
    }
    for (local_14 = 0; local_14 < (int)local_18; local_14 = local_14 + 1) {
      sprintf(myBuf2Str::str + local_14 * 3,"%02X ",(ulong)(uint)(int)*(char *)(in_RSI + local_14));
    }
    myBuf2Str::str[(int)(local_18 * 3 + -1)] = '\0';
  }
  return myBuf2Str::str;
}

Assistant:

static char *myBuf2Str(unsigned count, char *buf)
{
   static char str[128];
   int i, c;

   if (count && buf)
   {
      if (count > 40) c = 40; else c = count;

      for (i=0; i<c; i++) sprintf(str+(3*i), "%02X ", buf[i]);
      str[(3*c)-1] = 0;
   }
   else str[0] = 0;

   return str;
}